

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O0

color_quad_u8 * crnlib::dxt_fast::unpack_color(color_quad_u8 *c,uint v)

{
  uint bv;
  uint gv;
  uint rv;
  uint v_local;
  color_quad_u8 *c_local;
  
  (c->field_0).field_0.r = ryg_dxt::Expand5[(v & 0xf800) >> 0xb];
  (c->field_0).field_0.g = ryg_dxt::Expand6[(v & 0x7e0) >> 5];
  (c->field_0).field_0.b = ryg_dxt::Expand5[v & 0x1f];
  (c->field_0).field_0.a = '\0';
  return c;
}

Assistant:

static inline color_quad_u8& unpack_color(color_quad_u8& c, uint v)
        {
            uint rv = (v & 0xf800) >> 11;
            uint gv = (v & 0x07e0) >> 5;
            uint bv = (v & 0x001f) >> 0;

            c.r = ryg_dxt::Expand5[rv];
            c.g = ryg_dxt::Expand6[gv];
            c.b = ryg_dxt::Expand5[bv];
            c.a = 0;

            return c;
        }